

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImFont::AddGlyph(ImFont *this,ImFontConfig *cfg,ImWchar codepoint,float x0,float y0,float x1,
                float y1,float u0,float v0,float u1,float v1,float advance_x)

{
  int iVar1;
  ImFontGlyph *pIVar2;
  ImFontAtlas *pIVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  float fVar11;
  float fVar12;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar13 [16];
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined4 in_XMM2_Db;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  undefined1 auVar14 [16];
  undefined4 in_XMM3_Db;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  undefined1 auVar15 [16];
  undefined1 in_register_00001404 [12];
  float local_6c;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (cfg == (ImFontConfig *)0x0) {
    local_6c = advance_x;
    local_58 = x0;
    uStack_54 = in_XMM0_Db;
    uStack_50 = in_XMM0_Dc;
    uStack_4c = in_XMM0_Dd;
    local_48 = x1;
    uStack_44 = in_XMM2_Db;
    uStack_40 = in_XMM2_Dc;
    uStack_3c = in_XMM2_Dd;
  }
  else {
    auVar4 = vminss_avx(ZEXT416((uint)cfg->GlyphMaxAdvanceX),ZEXT416((uint)advance_x));
    uVar6 = vcmpss_avx512f(ZEXT416((uint)advance_x),ZEXT416((uint)cfg->GlyphMinAdvanceX),1);
    bVar7 = (bool)((byte)uVar6 & 1);
    fVar11 = (float)((uint)bVar7 * (int)cfg->GlyphMinAdvanceX + (uint)!bVar7 * auVar4._0_4_);
    bVar7 = cfg->PixelSnapH;
    if ((fVar11 != advance_x) || (NAN(fVar11) || NAN(advance_x))) {
      fVar12 = (fVar11 - advance_x) * 0.5;
      auVar4 = vcvtdq2ps_avx(ZEXT416((uint)(int)fVar12));
      fVar12 = (float)((uint)(bVar7 & 1) * auVar4._0_4_ + (uint)!(bool)(bVar7 & 1) * (int)fVar12);
      x0 = fVar12 + x0;
      in_XMM0_Db = 0;
      in_XMM0_Dc = 0;
      in_XMM0_Dd = 0;
      x1 = fVar12 + x1;
      in_XMM2_Db = 0;
      in_XMM2_Dc = 0;
      in_XMM2_Dd = 0;
    }
    auVar4 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar11 + 0.5)));
    local_6c = (float)((uint)(bVar7 & 1) * auVar4._0_4_ + (uint)!(bool)(bVar7 & 1) * (int)fVar11) +
               (cfg->GlyphExtraSpacing).x;
    local_58 = x0;
    uStack_54 = in_XMM0_Db;
    uStack_50 = in_XMM0_Dc;
    uStack_4c = in_XMM0_Dd;
    local_48 = x1;
    uStack_44 = in_XMM2_Db;
    uStack_40 = in_XMM2_Dc;
    uStack_3c = in_XMM2_Dd;
  }
  ImVector<ImFontGlyph>::resize(&this->Glyphs,(this->Glyphs).Size + 1);
  auVar9._4_4_ = in_XMM3_Db;
  auVar9._0_4_ = y1;
  auVar9._8_4_ = in_XMM3_Dc;
  auVar9._12_4_ = in_XMM3_Dd;
  auVar8._4_4_ = in_XMM1_Db;
  auVar8._0_4_ = y0;
  auVar8._8_4_ = in_XMM1_Dc;
  auVar8._12_4_ = in_XMM1_Dd;
  auVar13._4_4_ = uStack_44;
  auVar13._0_4_ = local_48;
  auVar13._8_4_ = uStack_40;
  auVar13._12_4_ = uStack_3c;
  auVar4._4_4_ = uStack_54;
  auVar4._0_4_ = local_58;
  auVar4._8_4_ = uStack_50;
  auVar4._12_4_ = uStack_4c;
  lVar10 = (long)(this->Glyphs).Size;
  pIVar2 = (this->Glyphs).Data;
  uVar6 = vcmpps_avx512vl(auVar8,auVar9,4);
  uVar5 = vcmpps_avx512vl(auVar4,auVar13,4);
  *(uint *)(pIVar2 + lVar10 + -1) = (uint)codepoint * 4 + ((uint)uVar6 & (uint)uVar5 & 1) * 2;
  pIVar2[lVar10 + -1].X0 = local_58;
  pIVar2[lVar10 + -1].Y0 = y0;
  pIVar2[lVar10 + -1].X1 = local_48;
  pIVar2[lVar10 + -1].Y1 = y1;
  pIVar2[lVar10 + -1].U0 = u0;
  pIVar2[lVar10 + -1].V0 = v0;
  pIVar2[lVar10 + -1].U1 = u1;
  pIVar2[lVar10 + -1].V1 = v1;
  pIVar2[lVar10 + -1].AdvanceX = local_6c;
  pIVar3 = this->ContainerAtlas;
  iVar1 = pIVar3->TexGlyphPadding;
  this->DirtyLookupTables = true;
  auVar14._0_4_ = (float)pIVar3->TexWidth;
  auVar14._4_12_ = in_register_00001404;
  auVar13 = ZEXT416((uint)((float)iVar1 + 0.99));
  auVar4 = vfmadd213ss_fma(auVar14,ZEXT416((uint)(u1 - u0)),auVar13);
  auVar15._0_4_ = (float)pIVar3->TexHeight;
  auVar15._4_12_ = in_register_00001404;
  auVar13 = vfmadd213ss_fma(auVar15,ZEXT416((uint)(v1 - v0)),auVar13);
  this->MetricsTotalSurface = this->MetricsTotalSurface + (int)auVar13._0_4_ * (int)auVar4._0_4_;
  return;
}

Assistant:

void ImFont::AddGlyph(const ImFontConfig* cfg, ImWchar codepoint, float x0, float y0, float x1, float y1, float u0, float v0, float u1, float v1, float advance_x)
{
    if (cfg != NULL)
    {
        // Clamp & recenter if needed
        const float advance_x_original = advance_x;
        advance_x = ImClamp(advance_x, cfg->GlyphMinAdvanceX, cfg->GlyphMaxAdvanceX);
        if (advance_x != advance_x_original)
        {
            float char_off_x = cfg->PixelSnapH ? ImFloor((advance_x - advance_x_original) * 0.5f) : (advance_x - advance_x_original) * 0.5f;
            x0 += char_off_x;
            x1 += char_off_x;
        }

        // Snap to pixel
        if (cfg->PixelSnapH)
            advance_x = IM_ROUND(advance_x);

        // Bake spacing
        advance_x += cfg->GlyphExtraSpacing.x;
    }

    Glyphs.resize(Glyphs.Size + 1);
    ImFontGlyph& glyph = Glyphs.back();
    glyph.Codepoint = (unsigned int)codepoint;
    glyph.Visible = (x0 != x1) && (y0 != y1);
    glyph.Colored = false;
    glyph.X0 = x0;
    glyph.Y0 = y0;
    glyph.X1 = x1;
    glyph.Y1 = y1;
    glyph.U0 = u0;
    glyph.V0 = v0;
    glyph.U1 = u1;
    glyph.V1 = v1;
    glyph.AdvanceX = advance_x;

    // Compute rough surface usage metrics (+1 to account for average padding, +0.99 to round)
    // We use (U1-U0)*TexWidth instead of X1-X0 to account for oversampling.
    float pad = ContainerAtlas->TexGlyphPadding + 0.99f;
    DirtyLookupTables = true;
    MetricsTotalSurface += (int)((glyph.U1 - glyph.U0) * ContainerAtlas->TexWidth + pad) * (int)((glyph.V1 - glyph.V0) * ContainerAtlas->TexHeight + pad);
}